

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall fmt::v9::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  size_t sVar2;
  uint *puVar3;
  bigint *in_RSI;
  bigint *in_RDI;
  int quotient;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  bigint *other;
  undefined4 local_4;
  
  if (in_RDI == in_RSI) {
    assert_fail(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)0x1ceee9);
  }
  iVar1 = compare(in_RSI,(bigint *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 < 0) {
    local_4 = 0;
  }
  else {
    other = in_RSI;
    sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RSI);
    puVar3 = buffer<unsigned_int>::operator[]<unsigned_long>
                       ((buffer<unsigned_int> *)in_RSI,sVar2 - 1);
    if (*puVar3 == 0) {
      assert_fail((char *)in_RSI,in_stack_ffffffffffffffcc,(char *)0x1cef4e);
    }
    align(in_RDI,other);
    local_4 = 0;
    do {
      subtract_aligned(in_RDI,other);
      local_4 = local_4 + 1;
      iVar1 = compare(other,(bigint *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
    } while (-1 < iVar1);
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR20 int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    align(divisor);
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }